

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O3

void __thiscall
Qentem::
HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
Reset(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
      *this)

{
  String<char> *this_00;
  SizeT *pointer;
  String<char> *pSVar1;
  
  if ((ulong)this->capacity_ != 0) {
    pointer = this->hashTable_;
    if ((ulong)this->index_ != 0) {
      this_00 = (String<char> *)(pointer + this->capacity_);
      pSVar1 = this_00 + (ulong)this->index_ * 3;
      do {
        Value<char>::~Value((Value<char> *)&this_00[1].length_);
        String<char>::deallocate(this_00);
        this_00 = this_00 + 3;
      } while (this_00 < pSVar1);
      pointer = this->hashTable_;
    }
    if (pointer != (SizeT *)0x0) {
      MemoryRecord::RemoveAllocation(pointer);
    }
    operator_delete(pointer);
    this->hashTable_ = (SizeT *)0x0;
    this->index_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

inline SizeT Capacity() const noexcept {
        return capacity_;
    }